

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::~small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  ~vector(&this->big_buffer_);
  paVar2 = &(this->small_buffer_)._M_elems[2].description.field_2;
  lVar3 = -0xd8;
  do {
    plVar1 = (long *)(((string *)(paVar2 + -1))->_M_dataplus)._M_p;
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
      operator_delete(plVar1,paVar2->_M_allocated_capacity + 1);
    }
    if ((long *)((long)paVar2 + -0x28) != *(long **)((long)paVar2 + -0x38)) {
      operator_delete(*(long **)((long)paVar2 + -0x38),*(long *)((long)paVar2 + -0x28) + 1);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar2 + -0x48);
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0);
  return;
}

Assistant:

~small_vector () noexcept = default;